

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall
capnp::JsonCodec::decodeObject
          (JsonCodec *this,Reader input,StructSchema type,Orphanage orphanage,Builder output)

{
  uint *__return_storage_ptr__;
  int *__return_storage_ptr___00;
  Field fieldSchema_00;
  Reader fieldValue;
  Orphanage orphanage_00;
  bool bVar1;
  NullableValue<capnp::StructSchema::Field> *other;
  Field *pFVar2;
  Impl *pIVar3;
  Iterator IVar4;
  ArrayPtr<const_char> local_288;
  Fault local_278;
  Fault f_1;
  DebugExpression<bool> _kjCondition_1;
  Reader local_228;
  RawBrandedSchema *local_1f8;
  undefined8 uStack_1f0;
  SegmentReader *local_1e8;
  CapTableReader *pCStack_1e0;
  void *local_1d8;
  WirePointer *pWStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  Field *local_1b0;
  Field *fieldSchema;
  size_t sStack_1a0;
  Field *local_198;
  size_t sStack_190;
  Maybe<capnp::StructSchema::Field> local_180;
  undefined1 local_138 [8];
  NullableValue<capnp::StructSchema::Field> _fieldSchema396;
  Reader field;
  undefined1 local_b0 [8];
  Iterator __end1;
  undefined1 local_90 [8];
  Iterator __begin1;
  Reader *__range1;
  Fault local_38;
  Fault f;
  DebugExpression<bool> _kjCondition;
  JsonCodec *this_local;
  Orphanage orphanage_local;
  StructSchema type_local;
  
  orphanage_local.arena = (BuilderArena *)orphanage.capTable;
  orphanage_local.capTable = (CapTableBuilder *)type.super_Schema.raw;
  f.exception._6_1_ = capnp::json::Value::Reader::isObject(&input);
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (bVar1) {
    __return_storage_ptr__ = &__begin1.index;
    capnp::json::Value::Reader::getObject((Reader *)__return_storage_ptr__,&input);
    IVar4 = List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader::begin
                      ((Reader *)__return_storage_ptr__);
    __end1._8_8_ = IVar4.container;
    __begin1.container._0_4_ = IVar4.index;
    local_90 = (undefined1  [8])__end1._8_8_;
    IVar4 = List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader::end
                      ((Reader *)__return_storage_ptr__);
    local_b0 = (undefined1  [8])IVar4.container;
    __end1.container._0_4_ = IVar4.index;
    while (bVar1 = capnp::_::
                   IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
                   ::operator==((IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
                                 *)local_90,
                                (IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
                                 *)local_b0), ((bVar1 ^ 0xffU) & 1) != 0) {
      __return_storage_ptr___00 = &_fieldSchema396.field_1.value.proto._reader.nestingLimit;
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
      ::operator*((Reader *)__return_storage_ptr___00,
                  (IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
                   *)local_90);
      _fieldSchema = (ArrayPtr<const_char>)
                     capnp::json::Value::Field::Reader::getName((Reader *)__return_storage_ptr___00)
      ;
      local_198 = fieldSchema;
      sStack_190 = sStack_1a0;
      StructSchema::findFieldByName
                (&local_180,(StructSchema *)&orphanage_local.capTable,(StringPtr)_fieldSchema);
      other = kj::_::readMaybe<capnp::StructSchema::Field>(&local_180);
      kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)local_138,other);
      kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_180);
      pFVar2 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_138);
      if (pFVar2 == (Field *)0x0) {
        pIVar3 = kj::Own<capnp::JsonCodec::Impl,_std::nullptr_t>::operator->(&this->impl);
        f_1.exception._6_1_ = ~pIVar3->rejectUnknownFields & 1;
        f_1.exception._7_1_ =
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                        (bool *)((long)&f_1.exception + 6));
        bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                          ((DebugExpression *)((long)&f_1.exception + 7));
        if (!bVar1) {
          local_288 = (ArrayPtr<const_char>)
                      capnp::json::Value::Field::Reader::getName
                                ((Reader *)&_fieldSchema396.field_1.value.proto._reader.nestingLimit
                                );
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[14],capnp::Text::Reader>
                    (&local_278,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                     ,399,FAILED,"!impl->rejectUnknownFields",
                     "_kjCondition,\"Unknown field\", field.getName()",
                     (DebugExpression<bool> *)((long)&f_1.exception + 7),
                     (char (*) [14])"Unknown field",(Reader *)&local_288);
          kj::_::Debug::Fault::fatal(&local_278);
        }
      }
      else {
        local_1b0 = kj::_::NullableValue<capnp::StructSchema::Field>::operator*
                              ((NullableValue<capnp::StructSchema::Field> *)local_138);
        local_1f8 = (local_1b0->parent).super_Schema.raw;
        uStack_1f0 = *(undefined8 *)&local_1b0->index;
        local_1e8 = (local_1b0->proto)._reader.segment;
        pCStack_1e0 = (local_1b0->proto)._reader.capTable;
        local_1d8 = (local_1b0->proto)._reader.data;
        pWStack_1d0 = (local_1b0->proto)._reader.pointers;
        local_1c8._0_4_ = (local_1b0->proto)._reader.dataSize;
        local_1c8._4_2_ = (local_1b0->proto)._reader.pointerCount;
        local_1c8._6_2_ = *(undefined2 *)&(local_1b0->proto)._reader.field_0x26;
        uStack_1c0 = *(undefined8 *)&(local_1b0->proto)._reader.nestingLimit;
        capnp::json::Value::Field::Reader::getValue
                  (&local_228,(Reader *)&_fieldSchema396.field_1.value.proto._reader.nestingLimit);
        orphanage_00.capTable = (CapTableBuilder *)orphanage_local.arena;
        orphanage_00.arena = orphanage.arena;
        fieldSchema_00._8_8_ = uStack_1f0;
        fieldSchema_00.parent.super_Schema.raw = (Schema)(Schema)local_1f8;
        fieldSchema_00.proto._reader.segment = local_1e8;
        fieldSchema_00.proto._reader.capTable = pCStack_1e0;
        fieldSchema_00.proto._reader.data = local_1d8;
        fieldSchema_00.proto._reader.pointers = pWStack_1d0;
        fieldSchema_00.proto._reader.dataSize = (undefined4)local_1c8;
        fieldSchema_00.proto._reader.pointerCount = local_1c8._4_2_;
        fieldSchema_00.proto._reader._38_2_ = local_1c8._6_2_;
        fieldSchema_00.proto._reader._40_8_ = uStack_1c0;
        fieldValue._reader.capTable = local_228._reader.capTable;
        fieldValue._reader.segment = local_228._reader.segment;
        fieldValue._reader.data = local_228._reader.data;
        fieldValue._reader.pointers = local_228._reader.pointers;
        fieldValue._reader.dataSize = local_228._reader.dataSize;
        fieldValue._reader.pointerCount = local_228._reader.pointerCount;
        fieldValue._reader._38_2_ = local_228._reader._38_2_;
        fieldValue._reader.nestingLimit = local_228._reader.nestingLimit;
        fieldValue._reader._44_4_ = local_228._reader._44_4_;
        decodeField(this,fieldSchema_00,fieldValue,orphanage_00,output);
      }
      kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)local_138);
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
      ::operator++((IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
                    *)local_90);
    }
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[22]>
              (&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x18a,FAILED,"input.isObject()","_kjCondition,\"Expected object value\"",
               (DebugExpression<bool> *)((long)&f.exception + 7),
               (char (*) [22])"Expected object value");
    kj::_::Debug::Fault::~Fault(&local_38);
  }
  return;
}

Assistant:

void JsonCodec::decodeObject(JsonValue::Reader input, StructSchema type, Orphanage orphanage, DynamicStruct::Builder output) const {
  KJ_REQUIRE(input.isObject(), "Expected object value") { return; }
  for (auto field: input.getObject()) {
    KJ_IF_SOME(fieldSchema, type.findFieldByName(field.getName())) {
      decodeField(fieldSchema, field.getValue(), orphanage, output);
    } else {
      KJ_REQUIRE(!impl->rejectUnknownFields, "Unknown field", field.getName());
    }
  }